

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O3

ArgString * __thiscall
Potassco::ArgString::get<Potassco::Set<Clasp::HeuParams::DomPref>>
          (ArgString *this,Set<Clasp::HeuParams::DomPref> *x)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  KV *pKVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  uint n;
  char *next;
  Set<Clasp::HeuParams::DomPref> local_3c;
  char *local_38;
  
  pcVar4 = this->in;
  if (pcVar4 == (char *)0x0) {
    return this;
  }
  cVar1 = *pcVar4;
  cVar2 = this->skip;
  iVar5 = Potassco::xconvert(pcVar4 + (cVar1 == cVar2),&local_3c.val,&local_38,0);
  if (iVar5 == 0) {
    local_38 = "";
    local_3c.val = 0;
    pKVar6 = findValue((Potassco *)&Clasp::enumMap(Clasp::HeuParams::DomPref_const*)::map,
                       (Span<Potassco::KV> *)0x6,pcVar4 + (cVar1 == cVar2),&local_38,",");
    if (pKVar6 != (KV *)0x0) {
      uVar8 = 0;
      do {
        local_3c.val = local_3c.val | pKVar6->value;
        uVar8 = uVar8 + 1;
        pKVar6 = findValue((Potassco *)&Clasp::enumMap(Clasp::HeuParams::DomPref_const*)::map,
                           (Span<Potassco::KV> *)0x6,local_38 + (*local_38 == ','),&local_38,",");
      } while (pKVar6 != (KV *)0x0);
      goto LAB_0012a81a;
    }
  }
  else {
    lVar7 = 8;
    uVar8 = 0;
    do {
      uVar3 = *(uint *)((long)&Clasp::enumMap(Clasp::HeuParams::DomPref_const*)::map + lVar7);
      uVar8 = uVar3 | uVar8;
      bVar9 = (local_3c.val & ~uVar8) == 0;
      if (lVar7 == 0x58) break;
      lVar7 = lVar7 + 0x10;
    } while ((!bVar9 || local_3c.val == 0) && local_3c.val != uVar3);
    uVar8 = (uint)(bVar9 && local_3c.val != 0 || local_3c.val == uVar3);
LAB_0012a81a:
    if (uVar8 != 0) {
      x->val = (uint)local_3c;
      goto LAB_0012a82e;
    }
  }
  local_38 = (char *)0x0;
LAB_0012a82e:
  this->in = local_38;
  this->skip = ',';
  return this;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}